

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_eol
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  char_t *pcVar2;
  byte *local_50;
  gap g;
  
  g.end = (char_t *)0x0;
  g.size = 0;
  while( true ) {
    do {
      local_50 = (byte *)s;
      bVar1 = *local_50;
      s = (char_t *)(local_50 + 1);
    } while (((anonymous_namespace)::chartype_table[bVar1] & 2) == 0);
    if (bVar1 == end_quote) break;
    if (bVar1 == 0xd) {
      *local_50 = 10;
      if (local_50[1] == 10) {
        local_50 = (byte *)s;
        gap::push(&g,(char_t **)&local_50,1);
        s = (char_t *)local_50;
      }
    }
    else if (bVar1 == 0) {
      return (char_t *)0x0;
    }
  }
  pcVar2 = gap::flush(&g,(char_t *)local_50);
  *pcVar2 = '\0';
  return (char_t *)(byte *)s;
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				while (!PUGI__IS_CHARTYPE(*s, ct_parse_attr)) ++s;
				
				if (*s == end_quote)
				{
					*g.flush(s) = 0;
				
					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';
					
					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}